

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

bitset_container_t * bitset_container_from_run(run_container_t *arr)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint64_t *puVar5;
  ulong uVar6;
  int32_t n_runs;
  long lVar7;
  bitset_container_t *pbVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar7 + 4) & 0x20) == 0) {
    iVar10 = arr->n_runs;
    lVar7 = (long)iVar10;
    if (0 < lVar7) {
      lVar9 = 0;
      do {
        iVar10 = iVar10 + (uint)arr->runs[lVar9].length;
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
    }
  }
  else {
    iVar10 = _avx2_run_container_cardinality(arr);
  }
  pbVar8 = bitset_container_create();
  iVar3 = arr->n_runs;
  if (0 < (long)iVar3) {
    prVar4 = arr->runs;
    puVar5 = pbVar8->words;
    lVar7 = 0;
    do {
      uVar1 = prVar4[lVar7].value;
      uVar2 = prVar4[lVar7].length;
      uVar11 = (uint)uVar2 + (uint)uVar1;
      uVar12 = (uint)(uVar1 >> 6);
      uVar13 = uVar11 >> 6;
      if (uVar13 - uVar12 == 0) {
        puVar5[uVar12] =
             puVar5[uVar12] |
             (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
      }
      else {
        uVar6 = puVar5[uVar13];
        puVar5[uVar12] = puVar5[uVar12] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar12 + 1 < uVar13) {
          memset(puVar5 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar13 - uVar12) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar5[uVar13] = uVar6 | 0xffffffffffffffffU >> (~(byte)uVar11 & 0x3f);
      }
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
  }
  pbVar8->cardinality = iVar10;
  return pbVar8;
}

Assistant:

bitset_container_t *bitset_container_from_run(const run_container_t *arr) {
    int card = run_container_cardinality(arr);
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        rle16_t vl = arr->runs[rlepos];
        bitset_set_lenrange(answer->words, vl.value, vl.length);
    }
    answer->cardinality = card;
    return answer;
}